

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O0

int cuddHashTableResize(DdHashTable *hash)

{
  uint uVar1;
  DdHashItem **__ptr;
  DdHashItem *pDVar2;
  _func_void_long *p_Var3;
  uint uVar4;
  int shift_00;
  DdHashItem **__s;
  DdNode **ppDVar5;
  byte bVar6;
  DD_OOMFP saveHandler;
  int oldNumBuckets;
  int shift;
  DdHashItem **oldBuckets;
  DdHashItem **buckets;
  int numBuckets;
  DdNode **key;
  DdHashItem *next;
  DdHashItem *item;
  uint posn;
  int j;
  DdHashTable *hash_local;
  
  p_Var3 = Extra_UtilMMoutOfMemory;
  __ptr = hash->bucket;
  uVar1 = hash->numBuckets;
  uVar4 = uVar1 << 1;
  Extra_UtilMMoutOfMemory = Cudd_OutOfMem;
  __s = (DdHashItem **)malloc((long)(int)uVar4 << 3);
  Extra_UtilMMoutOfMemory = p_Var3;
  if (__s == (DdHashItem **)0x0) {
    hash->maxsize = hash->maxsize << 1;
  }
  else {
    hash->bucket = __s;
    hash->numBuckets = uVar4;
    shift_00 = hash->shift + -1;
    hash->shift = shift_00;
    hash->maxsize = hash->maxsize << 1;
    memset(__s,0,(long)(int)uVar4 << 3);
    bVar6 = (byte)shift_00;
    if (hash->keysize == 1) {
      for (item._4_4_ = 0; item._4_4_ < (int)uVar1; item._4_4_ = item._4_4_ + 1) {
        next = __ptr[item._4_4_];
        while (next != (DdHashItem *)0x0) {
          pDVar2 = next->next;
          ppDVar5 = next->key;
          uVar4 = (((uint)(*(long *)(((ulong)*ppDVar5 & 0xfffffffffffffffe) + 0x20) << 1) |
                   (uint)*ppDVar5 & 1) * 0xc00005 +
                  ((uint)(*(long *)(((ulong)*ppDVar5 & 0xfffffffffffffffe) + 0x20) << 1) |
                  (uint)*ppDVar5 & 1)) * 0x40f1f9 >> (bVar6 & 0x1f);
          next->next = __s[uVar4];
          __s[uVar4] = next;
          next = pDVar2;
        }
      }
    }
    else if (hash->keysize == 2) {
      for (item._4_4_ = 0; item._4_4_ < (int)uVar1; item._4_4_ = item._4_4_ + 1) {
        next = __ptr[item._4_4_];
        while (next != (DdHashItem *)0x0) {
          pDVar2 = next->next;
          uVar4 = (((uint)(*(long *)(((ulong)next->key[0] & 0xfffffffffffffffe) + 0x20) << 1) |
                   (uint)next->key[0] & 1) * 0xc00005 +
                  ((uint)(*(long *)(((ulong)next[1].next & 0xfffffffffffffffe) + 0x20) << 1) |
                  (uint)next[1].next & 1)) * 0x40f1f9 >> (bVar6 & 0x1f);
          next->next = __s[uVar4];
          __s[uVar4] = next;
          next = pDVar2;
        }
      }
    }
    else if (hash->keysize == 3) {
      for (item._4_4_ = 0; item._4_4_ < (int)uVar1; item._4_4_ = item._4_4_ + 1) {
        next = __ptr[item._4_4_];
        while (next != (DdHashItem *)0x0) {
          pDVar2 = next->next;
          uVar4 = ((((uint)(*(long *)(((ulong)next[1].next & 0xfffffffffffffffe) + 0x20) << 1) |
                    (uint)next[1].next & 1) +
                   ((uint)(*(long *)(((ulong)next->key[0] & 0xfffffffffffffffe) + 0x20) << 1) |
                   (uint)next->key[0] & 1)) * 0xc00005 +
                  ((uint)(*(long *)((next[1].count & 0xfffffffffffffffeU) + 0x20) << 1) |
                  (uint)next[1].count & 1)) * 0x40f1f9 >> (bVar6 & 0x1f);
          next->next = __s[uVar4];
          __s[uVar4] = next;
          next = pDVar2;
        }
      }
    }
    else {
      for (item._4_4_ = 0; item._4_4_ < (int)uVar1; item._4_4_ = item._4_4_ + 1) {
        next = __ptr[item._4_4_];
        while (next != (DdHashItem *)0x0) {
          pDVar2 = next->next;
          uVar4 = ddLCHash(next->key,hash->keysize,shift_00);
          next->next = __s[uVar4];
          __s[uVar4] = next;
          next = pDVar2;
        }
      }
    }
    if (__ptr != (DdHashItem **)0x0) {
      free(__ptr);
    }
  }
  return 1;
}

Assistant:

static int
cuddHashTableResize(
  DdHashTable * hash)
{
    int j;
    unsigned int posn;
    DdHashItem *item;
    DdHashItem *next;
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    DdNode **key;
    int numBuckets;
    DdHashItem **buckets;
    DdHashItem **oldBuckets = hash->bucket;
#ifdef __osf__
#pragma pointer_size restore
#endif
    int shift;
    int oldNumBuckets = hash->numBuckets;
    extern DD_OOMFP MMoutOfMemory;
    DD_OOMFP saveHandler;

    /* Compute the new size of the table. */
    numBuckets = oldNumBuckets << 1;
    saveHandler = MMoutOfMemory;
    MMoutOfMemory = Cudd_OutOfMem;
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    buckets = ABC_ALLOC(DdHashItem *, numBuckets);
    MMoutOfMemory = saveHandler;
    if (buckets == NULL) {
        hash->maxsize <<= 1;
        return(1);
    }

    hash->bucket = buckets;
    hash->numBuckets = numBuckets;
    shift = --(hash->shift);
    hash->maxsize <<= 1;
    memset(buckets, 0, numBuckets * sizeof(DdHashItem *));
#ifdef __osf__
#pragma pointer_size restore
#endif
    if (hash->keysize == 1) {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                key = item->key;
                posn = ddLCHash2(cuddF2L(key[0]), cuddF2L(key[0]), shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    } else if (hash->keysize == 2) {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                key = item->key;
                posn = ddLCHash2(cuddF2L(key[0]), cuddF2L(key[1]), shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    } else if (hash->keysize == 3) {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                key = item->key;
                posn = ddLCHash3(cuddF2L(key[0]), cuddF2L(key[1]), cuddF2L(key[2]), shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    } else {
        for (j = 0; j < oldNumBuckets; j++) {
            item = oldBuckets[j];
            while (item != NULL) {
                next = item->next;
                posn = ddLCHash(item->key, hash->keysize, shift);
                item->next = buckets[posn];
                buckets[posn] = item;
                item = next;
            }
        }
    }
    ABC_FREE(oldBuckets);
    return(1);

}